

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O0

greatest_test_res inflate_max_matchlen_alt(void)

{
  ulong local_128;
  size_t i;
  int res;
  uint dlen;
  uchar out [259];
  greatest_test_res local_c;
  
  i._4_4_ = 0x103;
  memset(&res,0xff,0x103);
  i._0_4_ = tinf_uncompress(&res,(uint *)((long)&i + 4),inflate_max_matchlen_alt::data,0x10);
  greatest_info.assertions = greatest_info.assertions + 1;
  if (((int)i == 0) && (i._4_4_ == 0x103)) {
    for (local_128 = 0; local_128 < 0x103; local_128 = local_128 + 1) {
      if (*(char *)((long)&res + local_128) != '\0') {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
        greatest_info.fail_line = 0x146;
        greatest_info.msg = (char *)0x0;
        if ((greatest_info.flags & 4) == 0) {
          greatest_info.fail_line = 0x146;
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
          greatest_info.msg = (char *)0x0;
          return GREATEST_TEST_RES_FAIL;
        }
        abort();
      }
    }
    greatest_info.msg = (char *)0x0;
    local_c = GREATEST_TEST_RES_PASS;
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
    greatest_info.fail_line = 0x142;
    greatest_info.msg = "res == TINF_OK && dlen == ARRAY_SIZE(out)";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    local_c = GREATEST_TEST_RES_FAIL;
  }
  return local_c;
}

Assistant:

TEST inflate_max_matchlen_alt(void)
{
	/* 259 zero bytes compressed using literal/length code 284 + 31 (len 258)
	 *
	 * Technically, this is outside the range specified in the RFC, but
	 * gzip allows it.
	 *
	 * See also: https://github.com/madler/zlib/issues/75
	 */
	static const unsigned char data[] = {
		0xE5, 0xCC, 0x81, 0x00, 0x00, 0x00, 0x00, 0x80, 0xA0, 0xFC,
		0xA9, 0x07, 0xB9, 0x00, 0xFC, 0x05
	};
	unsigned char out[259];
	unsigned int dlen = ARRAY_SIZE(out);
	int res;
	size_t i;

	memset(out, 0xFF, ARRAY_SIZE(out));

	res = tinf_uncompress(out, &dlen, data, ARRAY_SIZE(data));

	ASSERT(res == TINF_OK && dlen == ARRAY_SIZE(out));

	for (i = 0; i < ARRAY_SIZE(out); ++i) {
		if (out[i]) {
			FAIL();
		}
	}

	PASS();
}